

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

int mbedtls_md_update(mbedtls_md_context_t *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    switch(ctx->md_info->type) {
    case MBEDTLS_MD_MD5:
      iVar1 = mbedtls_md5_update_ret((mbedtls_md5_context *)ctx->md_ctx,input,ilen);
      return iVar1;
    case MBEDTLS_MD_SHA1:
      iVar1 = mbedtls_sha1_update_ret((mbedtls_sha1_context *)ctx->md_ctx,input,ilen);
      return iVar1;
    case MBEDTLS_MD_SHA224:
    case MBEDTLS_MD_SHA256:
      iVar1 = mbedtls_sha256_update_ret((mbedtls_sha256_context *)ctx->md_ctx,input,ilen);
      return iVar1;
    case MBEDTLS_MD_SHA384:
    case MBEDTLS_MD_SHA512:
      iVar1 = mbedtls_sha512_update_ret((mbedtls_sha512_context *)ctx->md_ctx,input,ilen);
      return iVar1;
    case MBEDTLS_MD_RIPEMD160:
      iVar1 = mbedtls_ripemd160_update_ret((mbedtls_ripemd160_context *)ctx->md_ctx,input,ilen);
      return iVar1;
    }
  }
  return -0x5100;
}

Assistant:

int mbedtls_md_update( mbedtls_md_context_t *ctx, const unsigned char *input, size_t ilen )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    switch( ctx->md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            return( mbedtls_md2_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            return( mbedtls_md4_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            return( mbedtls_md5_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            return( mbedtls_ripemd160_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            return( mbedtls_sha1_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
            return( mbedtls_sha256_update_ret( ctx->md_ctx, input, ilen ) );
        case MBEDTLS_MD_SHA256:
            return( mbedtls_sha256_update_ret( ctx->md_ctx, input, ilen ) );
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
            return( mbedtls_sha512_update_ret( ctx->md_ctx, input, ilen ) );
#endif
        case MBEDTLS_MD_SHA512:
            return( mbedtls_sha512_update_ret( ctx->md_ctx, input, ilen ) );
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }
}